

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::update_unchoke_limit(session_impl *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  _Base_ptr p_Var5;
  shared_ptr<libtorrent::aux::torrent> t;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  iVar3 = get_int_setting(this,0x4053);
  counters::set_value(&this->m_stats_counters,0xfd,(long)iVar3);
  iVar4 = session_settings::get_int(&this->m_settings,0x4047);
  if ((iVar3 / 2 <= iVar4) && (((this->m_alerts).m_alert_mask._M_i.m_val >> 9 & 1) != 0)) {
    t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40._M_ptr._0_4_ = 5;
    alert_manager::
    emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
              (&this->m_alerts,(torrent_handle *)&t,(performance_warning_t *)&local_40);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
               &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  iVar4 = session_settings::get_int(&this->m_settings,0x401f);
  if (iVar4 == 0) {
    if (iVar3 == 0x7fffffff) {
      for (p_Var5 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5)) {
        cVar1 = (**(code **)(**(long **)(p_Var5 + 1) + 8))();
        if ((cVar1 == '\0') && ((*(byte *)(*(long **)(p_Var5 + 1) + 6) & 2) == 0)) {
          cVar1 = (**(code **)(**(long **)(p_Var5 + 1) + 0x60))();
          if (cVar1 != '\0') {
            cVar1 = (**(code **)(**(long **)(p_Var5 + 1) + 0xd8))();
            if (cVar1 == '\0') {
              bVar2 = peer_connection::ignore_unchoke_slots(*(peer_connection **)(p_Var5 + 1));
              if (!bVar2) {
                ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                          (&local_40,
                           (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                           (*(long *)(p_Var5 + 1) + 0x10));
                ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr(&t.
                              super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                             ,&local_40);
                ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                          (&local_40._M_refcount);
                torrent::unchoke_peer
                          (t.
                           super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,*(peer_connection **)(p_Var5 + 1),false);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
            }
          }
        }
      }
    }
    else {
      this->m_unchoke_time_scaler = 0;
    }
  }
  return;
}

Assistant:

void session_impl::update_unchoke_limit()
	{
		int const allowed_upload_slots = get_int_setting(settings_pack::unchoke_slots_limit);

		m_stats_counters.set_value(counters::num_unchoke_slots
			, allowed_upload_slots);

		if (m_settings.get_int(settings_pack::num_optimistic_unchoke_slots)
			>= allowed_upload_slots / 2)
		{
			if (m_alerts.should_post<performance_alert>())
				m_alerts.emplace_alert<performance_alert>(torrent_handle()
					, performance_alert::too_many_optimistic_unchoke_slots);
		}

		if (settings().get_int(settings_pack::choking_algorithm) != settings_pack::fixed_slots_choker)
			return;

		if (allowed_upload_slots == std::numeric_limits<int>::max())
		{
			// this means we're not applying upload slot limits, unchoke
			// everyone
			for (auto const& p : m_connections)
			{
				if (p->is_disconnecting()
					|| p->is_connecting()
					|| !p->is_choked()
					|| p->in_handshake()
					|| p->ignore_unchoke_slots()
					)
					continue;

				auto const t = p->associated_torrent().lock();
				t->unchoke_peer(*p);
			}
		}
		else
		{
			// trigger recalculating unchoke slots
			m_unchoke_time_scaler = 0;
		}
	}